

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void parse_command(int argc,char **argv)

{
  bool bVar1;
  bool local_e1;
  allocator<char> local_c1;
  string local_c0;
  _Self local_a0;
  _Self local_98;
  undefined1 local_90 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  param;
  int i;
  allocator<char> local_39;
  string local_38;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_18 = argv;
  argv_local._4_4_ = argc;
  if (argc == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    help_main(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    std::__cxx11::string::operator=((string *)&args,argv[1]);
    for (param.second.field_2._8_4_ = 2; (int)param.second.field_2._8_4_ < argv_local._4_4_;
        param.second.field_2._8_4_ = param.second.field_2._8_4_ + 1) {
      if (*local_18[(int)param.second.field_2._8_4_] == '-') {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_90);
        std::__cxx11::string::operator=
                  ((string *)local_90,local_18[(int)param.second.field_2._8_4_]);
        local_98._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&hasargoption_abi_cxx11_,(key_type *)local_90);
        local_a0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&hasargoption_abi_cxx11_);
        local_e1 = std::operator!=(&local_98,&local_a0);
        local_e1 = local_e1 && param.second.field_2._8_4_ + 1 < argv_local._4_4_;
        if (local_e1) {
          std::__cxx11::string::operator=
                    ((string *)(param.first.field_2._M_local_buf + 8),
                     local_18[(long)(int)param.second.field_2._8_4_ + 1]);
          param.second.field_2._8_4_ = param.second.field_2._8_4_ + 1;
        }
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>&>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&args.options,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_90);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_90);
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &args.packages,local_18 + (int)param.second.field_2._8_4_);
      }
    }
    bVar1 = std::operator==(&args.command,"help");
    if (((bVar1) || (bVar1 = std::operator==(&args.command,"-h"), bVar1)) ||
       (bVar1 = std::operator==(&args.command,"--help"), bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
      help_main(&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    bVar1 = std::operator==(&args.command,"-V");
    if ((bVar1) || (bVar1 = std::operator==(&args.command,"--version"), bVar1)) {
      print_version();
    }
    bVar1 = std::operator==(&args.command,"install");
    if (bVar1) {
      parse_install();
    }
    bVar1 = std::operator==(&args.command,"download");
    if (bVar1) {
      parse_download();
    }
    bVar1 = std::operator==(&args.command,"uninstall");
    if (bVar1) {
      parse_uninstall();
    }
    bVar1 = std::operator==(&args.command,"freeze");
    if (bVar1) {
      parse_freeze();
    }
    bVar1 = std::operator==(&args.command,"archive");
    if (bVar1) {
      parse_archive();
    }
  }
  return;
}

Assistant:

void parse_command(int argc,char** argv) noexcept(false){
    if(argc==1){
        help_main();
        return;
    }
    args.command=argv[1];
    for(int i=2;i<argc;i++){
        if(argv[i][0]=='-') {
            std::pair<std::string,std::string> param;
            param.first=argv[i];
            if(hasargoption.find(param.first)!=hasargoption.end() && i+1<argc){
                param.second=argv[i+1];
                i++;
            }
            args.options.emplace_back(param);
        }else
            args.packages.emplace_back(argv[i]);
    }
    if(args.command=="help" || args.command=="-h" || args.command=="--help")
        help_main();
    if(args.command=="-V" || args.command=="--version")
        print_version();
    if(args.command=="install")
        parse_install();
    if(args.command=="download")
        parse_download();
    if(args.command=="uninstall")
        parse_uninstall();
    if(args.command=="freeze")
        parse_freeze();
    if(args.command=="archive")
        parse_archive();
}